

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

float tcu::computeBilinearSearchStepFromFloatLine(LookupPrecision *prec,ColorLine *line)

{
  float fVar1;
  float step;
  undefined1 local_5c [8];
  Vec4 minStep;
  Vec4 stepCount;
  undefined1 local_2c [8];
  Vec4 d;
  int maxSteps;
  ColorLine *line_local;
  LookupPrecision *prec_local;
  
  d.m_data[2] = 9.18355e-41;
  unique0x10000167 = line;
  operator-((tcu *)(stepCount.m_data + 2),&line->p1,&line->p0);
  abs<float,4>((tcu *)local_2c,(Vector<float,_4> *)(stepCount.m_data + 2));
  operator/((tcu *)(minStep.m_data + 2),(Vector<float,_4> *)local_2c,&prec->colorThreshold);
  operator+((tcu *)&stack0xffffffffffffff94,(Vector<float,_4> *)(minStep.m_data + 2),1.0);
  operator/((tcu *)local_5c,1.0,(Vector<float,_4> *)&stack0xffffffffffffff94);
  fVar1 = minComp<float,4>((Vector<float,_4> *)local_5c);
  fVar1 = de::max<float>(fVar1,1.5258789e-05);
  return fVar1;
}

Assistant:

static float computeBilinearSearchStepFromFloatLine (const LookupPrecision&	prec,
													 const ColorLine&		line)
{
	DE_ASSERT(boolAll(greaterThan(prec.colorThreshold, Vec4(0.0f))));

	const int		maxSteps	= 1<<16;
	const Vec4		d			= abs(line.p1 - line.p0);
	const Vec4		stepCount	= d / prec.colorThreshold;
	const Vec4		minStep		= 1.0f / (stepCount + 1.0f);
	const float		step		= de::max(minComp(minStep), 1.0f / float(maxSteps));

	return step;
}